

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

int32_t ecs_reader_read(char *buffer,int32_t size,ecs_reader_t *reader)

{
  char *__s;
  int32_t i;
  ecs_blob_header_kind_t eVar1;
  int iVar2;
  int32_t iVar3;
  void *pvVar4;
  long lVar5;
  ecs_blob_header_kind_t *__dest;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  int32_t iVar10;
  bool bVar11;
  
  if (size == 0) {
    iVar10 = 0;
  }
  else {
    _ecs_assert(3 < size,2,(char *)0x0,"size >= ECS_SIZEOF(int32_t)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                ,0x14f);
    if (size < 4) {
      __assert_fail("size >= (ecs_size_t)sizeof(int32_t)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x14f,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
    }
    iVar10 = 0;
    _ecs_assert((size & 3U) == 0,2,(char *)0x0,"size % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                ,0x150);
    if ((size & 3U) != 0) {
      __assert_fail("size % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x150,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
    }
    if (reader->state == EcsTableSegment) {
      iVar10 = 0;
      while (size != 0) {
        uVar6 = 0xffffffff;
        if (size < 4) goto LAB_00134917;
        eVar1 = (reader->table).state;
        if (EcsTableColumnName < eVar1) {
switchD_00134658_caseD_1:
          _ecs_abort(0xc,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                     ,0x13c);
          abort();
        }
        __dest = (ecs_blob_header_kind_t *)(buffer + iVar10);
        switch(eVar1) {
        case EcsStreamHeader:
          next_table(reader,&reader->table);
          (reader->table).state = EcsTableHeader;
          eVar1 = EcsTableHeader;
          break;
        default:
          goto switchD_00134658_caseD_1;
        case EcsTableHeader:
        case EcsTableColumnHeader:
        case EcsTableColumnNameHeader:
          break;
        case EcsTableTypeSize:
          eVar1 = ecs_vector_count((reader->table).type);
          break;
        case EcsTableType:
          pvVar4 = _ecs_vector_first((reader->table).type,8,0x10);
          *__dest = *(ecs_blob_header_kind_t *)((long)(reader->table).type_written + (long)pvVar4);
          iVar8 = (reader->table).type_written + 4;
          (reader->table).type_written = iVar8;
          iVar3 = ecs_vector_count((reader->table).type);
          bVar11 = iVar8 == iVar3 << 3;
          goto LAB_0013499a;
        case EcsTableSize:
          eVar1 = ecs_table_count((reader->table).table);
          break;
        case EcsTableColumnSize:
          *__dest = (int)(reader->table).column_size;
          ecs_table_reader_next(reader);
          bVar11 = (reader->table).column_size == 0;
          goto LAB_0013499a;
        case EcsTableColumnData:
          iVar2 = (int)(reader->table).column_size * (reader->table).row_count;
          iVar8 = (reader->table).column_written;
          uVar6 = iVar2 - iVar8;
          if (size <= (int)uVar6) {
            uVar6 = size;
          }
          memcpy(__dest,(void *)((long)iVar8 + (long)(reader->table).column_data),(long)(int)uVar6);
          iVar8 = (reader->table).column_written + uVar6;
          (reader->table).column_written = iVar8;
          _ecs_assert(iVar8 <= iVar2,0xc,(char *)0x0,"reader->column_written <= column_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                      ,0xf9);
          iVar8 = (reader->table).column_written;
          if (iVar2 < iVar8) {
            __assert_fail("reader->column_written <= column_bytes",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                          ,0xf9,"ecs_size_t ecs_table_reader(char *, ecs_size_t, ecs_reader_t *)");
          }
          uVar7 = uVar6 + 2;
          if (-1 < (int)(uVar6 - 1)) {
            uVar7 = uVar6 - 1;
          }
          uVar7 = (uVar7 & 0xfffffffc) + 4;
          if (uVar7 - uVar6 != 0) {
            memset((void *)((long)__dest + (long)(int)uVar6),0,(long)(int)(uVar7 - uVar6));
            _ecs_assert((int)uVar7 <= size,0xc,(char *)0x0,"read <= size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                        ,0x106);
            if (size < (int)uVar7) {
              __assert_fail("read <= size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                            ,0x106,"ecs_size_t ecs_table_reader(char *, ecs_size_t, ecs_reader_t *)"
                           );
            }
            iVar8 = (reader->table).column_written;
            uVar6 = uVar7;
          }
          if (iVar8 == iVar2) {
            ecs_table_reader_next(reader);
          }
          _ecs_assert((uVar6 & 3) == 0,0xc,(char *)0x0,"read % 4 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                      ,0x13f);
          if ((uVar6 & 3) != 0) {
            __assert_fail("read % 4 == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                          ,0x13f,"ecs_size_t ecs_table_reader(char *, ecs_size_t, ecs_reader_t *)");
          }
          if (uVar6 == 0) {
            return iVar10;
          }
          goto LAB_00134917;
        case EcsTableColumnNameLength:
          __s = *(char **)((long)(reader->table).column_data +
                          (long)(reader->table).row_index * 0x18);
          (reader->table).name = __s;
          sVar9 = strlen(__s);
          eVar1 = (int)sVar9 + EcsTableSegment;
          (reader->table).name_len = eVar1;
          (reader->table).name_written = 0;
          break;
        case EcsTableColumnName:
          lVar5 = (long)(reader->table).name_written;
          sVar9 = (reader->table).name_len - lVar5;
          if ((int)sVar9 < 4) {
            memcpy(__dest,(reader->table).name + lVar5,sVar9);
            memset((void *)((long)__dest + sVar9),0,(ulong)(4 - (int)sVar9));
          }
          else {
            lVar5 = 0;
            do {
              *(char *)((long)__dest + lVar5) =
                   (reader->table).name[lVar5 + (reader->table).name_written];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
            sVar9 = 4;
          }
          iVar8 = (int)sVar9 + (reader->table).name_written;
          (reader->table).name_written = iVar8;
          bVar11 = iVar8 == (reader->table).name_len;
LAB_0013499a:
          if (bVar11) goto LAB_001348e4;
          goto LAB_001348ec;
        }
        *__dest = eVar1;
LAB_001348e4:
        ecs_table_reader_next(reader);
LAB_001348ec:
        _ecs_assert(true,0xc,(char *)0x0,"read % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x13f);
        uVar6 = 4;
LAB_00134917:
        iVar10 = iVar10 + uVar6;
        if (reader->state != EcsTableSegment) {
          return iVar10;
        }
        size = size - uVar6;
        _ecs_assert((size & 3U) == 0,0xc,(char *)0x0,"remaining % 4 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                    ,0x15b);
        if ((size & 3U) != 0) {
          __assert_fail("remaining % 4 == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/reader.c"
                        ,0x15b,"int32_t ecs_reader_read(char *, int32_t, ecs_reader_t *)");
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int32_t ecs_reader_read(
    char *buffer,
    int32_t size,
    ecs_reader_t *reader)
{
    int32_t read, total_read = 0, remaining = size;

    if (!size) {
        return 0;
    }

    ecs_assert(size >= ECS_SIZEOF(int32_t), ECS_INVALID_PARAMETER, NULL);
    ecs_assert(size % 4 == 0, ECS_INVALID_PARAMETER, NULL);

    if (reader->state == EcsTableSegment) {
        while ((read = ecs_table_reader(ECS_OFFSET(buffer, total_read), remaining, reader))) {
            remaining -= read;
            total_read += read;

            if (reader->state != EcsTableSegment) {
                break;
            }

            ecs_assert(remaining % 4 == 0, ECS_INTERNAL_ERROR, NULL);        
        }
    }  
    
    return total_read;
}